

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTruth.c
# Opt level: O3

int Hop_ManConvertAigToTruth_rec1(Hop_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopTruth.c"
                  ,0x4c,"int Hop_ManConvertAigToTruth_rec1(Hop_Obj_t *)");
  }
  iVar1 = 0;
  if ((*(uint *)&pObj->field_0x20 & 0x16) == 4) {
    iVar1 = Hop_ManConvertAigToTruth_rec1((Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    iVar2 = Hop_ManConvertAigToTruth_rec1((Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
    if ((*(uint *)&pObj->field_0x20 & 0x10) != 0) {
      __assert_fail("!Hop_ObjIsMarkA(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopTruth.c"
                    ,0x51,"int Hop_ManConvertAigToTruth_rec1(Hop_Obj_t *)");
    }
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 | 0x10;
    iVar1 = iVar2 + iVar1 + 1;
  }
  return iVar1;
}

Assistant:

int Hop_ManConvertAigToTruth_rec1( Hop_Obj_t * pObj )
{
    int Counter = 0;
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || Hop_ObjIsMarkA(pObj) )
        return 0;
    Counter += Hop_ManConvertAigToTruth_rec1( Hop_ObjFanin0(pObj) ); 
    Counter += Hop_ManConvertAigToTruth_rec1( Hop_ObjFanin1(pObj) );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA( pObj );
    return Counter + 1;
}